

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this)

{
  DataLocation *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar2;
  DataLocation *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (DataLocation *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->endPtr = (DataLocation *)0x0;
    this->ptr = (DataLocation *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)
                0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pDVar1,8,(long)pRVar2 - (long)pDVar1 >> 3,
               (long)pDVar3 - (long)pDVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }